

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateBuilderParsingCode
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType JVar2;
  FieldDescriptor *field;
  char *pcVar3;
  size_t sVar4;
  string_view text;
  
  field = MapValueField(this->descriptor_);
  JVar2 = GetJavaType(field);
  if (JVar2 == JAVATYPE_MESSAGE) {
    pcVar3 = 
    "com.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = input.readMessage(\n    $default_entry$.getParserForType(), extensionRegistry);\ninternalGetMutable$capitalized_name$().ensureBuilderMap().put(\n    $name$__.getKey(), $name$__.getValue());\n$set_has_field_bit_builder$\n"
    ;
    sVar4 = 0x112;
  }
  else {
    bVar1 = SupportUnknownEnumValue(field);
    if (JVar2 == JAVATYPE_ENUM && !bVar1) {
      pcVar3 = 
      "com.google.protobuf.ByteString bytes = input.readBytes();\ncom.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = $default_entry$.getParserForType().parseFrom(bytes);\nif ($value_enum_type$.forNumber($name$__.getValue()) == null) {\n  mergeUnknownLengthDelimitedField($number$, bytes);\n} else {\n  internalGetMutable$capitalized_name$().getMutableMap().put(\n      $name$__.getKey(), $name$__.getValue());\n  $set_has_field_bit_builder$\n}\n"
      ;
      sVar4 = 0x1b5;
    }
    else {
      pcVar3 = 
      "com.google.protobuf.MapEntry<$type_parameters$>\n$name$__ = input.readMessage(\n    $default_entry$.getParserForType(), extensionRegistry);\ninternalGetMutable$capitalized_name$().getMutableMap().put(\n    $name$__.getKey(), $name$__.getValue());\n$set_has_field_bit_builder$\n"
      ;
      sVar4 = 0x10f;
    }
  }
  text._M_str = pcVar3;
  text._M_len = sVar4;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  const FieldDescriptor* value = MapValueField(descriptor_);
  const JavaType type = GetJavaType(value);
  if (type == JAVATYPE_MESSAGE) {
    printer->Print(
        variables_,
        "com.google.protobuf.MapEntry<$type_parameters$>\n"
        "$name$__ = input.readMessage(\n"
        "    $default_entry$.getParserForType(), extensionRegistry);\n"
        "internalGetMutable$capitalized_name$().ensureBuilderMap().put(\n"
        "    $name$__.getKey(), $name$__.getValue());\n"
        "$set_has_field_bit_builder$\n");
    return;
  }
  if (!SupportUnknownEnumValue(value) && type == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "com.google.protobuf.ByteString bytes = input.readBytes();\n"
        "com.google.protobuf.MapEntry<$type_parameters$>\n"
        "$name$__ = $default_entry$.getParserForType().parseFrom(bytes);\n"
        "if ($value_enum_type$.forNumber($name$__.getValue()) == null) {\n"
        "  mergeUnknownLengthDelimitedField($number$, bytes);\n"
        "} else {\n"
        "  internalGetMutable$capitalized_name$().getMutableMap().put(\n"
        "      $name$__.getKey(), $name$__.getValue());\n"
        "  $set_has_field_bit_builder$\n"
        "}\n");
    return;
  }
  printer->Print(variables_,
                 "com.google.protobuf.MapEntry<$type_parameters$>\n"
                 "$name$__ = input.readMessage(\n"
                 "    $default_entry$.getParserForType(), extensionRegistry);\n"
                 "internalGetMutable$capitalized_name$().getMutableMap().put(\n"
                 "    $name$__.getKey(), $name$__.getValue());\n"
                 "$set_has_field_bit_builder$\n");
}